

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::GetRotationMatrix
          (FBXConverter *this,RotOrder mode,aiVector3D *rotation,aiMatrix4x4 *out)

{
  float fVar1;
  double dVar2;
  aiMatrix4x4t<float> *local_210;
  aiMatrix4x4t<float> local_208;
  aiMatrix4x4t<float> local_1c8;
  undefined8 local_188;
  int order [3];
  aiMatrix4x4 temp [3];
  ushort local_af;
  undefined1 local_ad;
  undefined1 local_ac [5];
  bool is_id [3];
  float angle_epsilon;
  aiMatrix4x4 *local_28;
  aiMatrix4x4 *out_local;
  aiVector3D *rotation_local;
  FBXConverter *pFStack_10;
  RotOrder mode_local;
  FBXConverter *this_local;
  
  local_28 = out;
  out_local = (aiMatrix4x4 *)rotation;
  rotation_local._4_4_ = mode;
  pFStack_10 = this;
  if (mode == RotOrder_SphericXYZ) {
    LogFunctions<Assimp::FBXImporter>::LogError("Unsupported RotationMode: SphericXYZ");
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&stack0xffffffffffffff98);
    memcpy(local_28,&stack0xffffffffffffff98,0x40);
  }
  else {
    fVar1 = Math::getEpsilon<float>();
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_ac);
    memcpy(local_28,local_ac,0x40);
    local_af = 0x101;
    local_ad = 1;
    local_210 = (aiMatrix4x4t<float> *)(order + 2);
    do {
      aiMatrix4x4t<float>::aiMatrix4x4t(local_210);
      local_210 = local_210 + 1;
    } while (local_210 != (aiMatrix4x4t<float> *)&temp[2].d3);
    dVar2 = std::fabs((double)(ulong)(uint)out_local->a3);
    if (fVar1 < SUB84(dVar2,0)) {
      aiMatrix4x4t<float>::RotationZ(out_local->a3 * 0.017453292,(aiMatrix4x4t<float> *)&temp[1].d3)
      ;
      local_ad = 0;
    }
    dVar2 = std::fabs((double)(ulong)(uint)out_local->a2);
    if (fVar1 < SUB84(dVar2,0)) {
      aiMatrix4x4t<float>::RotationY(out_local->a2 * 0.017453292,(aiMatrix4x4t<float> *)&temp[0].d3)
      ;
      local_af = local_af & 0xff;
    }
    dVar2 = std::fabs((double)(ulong)(uint)out_local->a1);
    if (fVar1 < SUB84(dVar2,0)) {
      aiMatrix4x4t<float>::RotationX(out_local->a1 * 0.017453292,(aiMatrix4x4t<float> *)(order + 2))
      ;
      local_af = local_af & 0xff00;
    }
    order[0] = -1;
    local_188 = 0xffffffffffffffff;
    switch(rotation_local._4_4_) {
    case RotOrder_EulerXYZ:
      local_188._0_4_ = 2;
      local_188._4_4_ = 1;
      order[0] = 0;
      break;
    case RotOrder_EulerXZY:
      local_188._0_4_ = 1;
      local_188._4_4_ = 2;
      order[0] = 0;
      break;
    case RotOrder_EulerYZX:
      local_188._0_4_ = 0;
      local_188._4_4_ = 2;
      order[0] = 1;
      break;
    case RotOrder_EulerYXZ:
      local_188._0_4_ = 2;
      local_188._4_4_ = 0;
      order[0] = 1;
      break;
    case RotOrder_EulerZXY:
      local_188._0_4_ = 1;
      local_188._4_4_ = 0;
      order[0] = 2;
      break;
    case RotOrder_EulerZYX:
      local_188._0_4_ = 0;
      local_188._4_4_ = 1;
      order[0] = 2;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x286,
                    "void Assimp::FBX::FBXConverter::GetRotationMatrix(Model::RotOrder, const aiVector3D &, aiMatrix4x4 &)"
                   );
    }
    if (2 < (uint)local_188) {
      __assert_fail("order[0] <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x28b,
                    "void Assimp::FBX::FBXConverter::GetRotationMatrix(Model::RotOrder, const aiVector3D &, aiMatrix4x4 &)"
                   );
    }
    if (2 < local_188._4_4_) {
      __assert_fail("order[1] <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x28d,
                    "void Assimp::FBX::FBXConverter::GetRotationMatrix(Model::RotOrder, const aiVector3D &, aiMatrix4x4 &)"
                   );
    }
    if (2 < (uint)order[0]) {
      __assert_fail("order[2] <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x28f,
                    "void Assimp::FBX::FBXConverter::GetRotationMatrix(Model::RotOrder, const aiVector3D &, aiMatrix4x4 &)"
                   );
    }
    if ((*(byte *)((long)&local_af + (long)(int)(uint)local_188) & 1) == 0) {
      memcpy(local_28,order + (long)(int)(uint)local_188 * 0x10 + 2,0x40);
    }
    if ((*(byte *)((long)&local_af + (long)(int)local_188._4_4_) & 1) == 0) {
      aiMatrix4x4t<float>::operator*
                (&local_1c8,local_28,
                 (aiMatrix4x4t<float> *)(order + (long)(int)local_188._4_4_ * 0x10 + 2));
      memcpy(local_28,&local_1c8,0x40);
    }
    if ((*(byte *)((long)&local_af + (long)order[0]) & 1) == 0) {
      aiMatrix4x4t<float>::operator*
                (&local_208,local_28,(aiMatrix4x4t<float> *)(order + (long)order[0] * 0x10 + 2));
      memcpy(local_28,&local_208,0x40);
    }
  }
  return;
}

Assistant:

void FBXConverter::GetRotationMatrix(Model::RotOrder mode, const aiVector3D& rotation, aiMatrix4x4& out)
        {
            if (mode == Model::RotOrder_SphericXYZ) {
                FBXImporter::LogError("Unsupported RotationMode: SphericXYZ");
                out = aiMatrix4x4();
                return;
            }

            const float angle_epsilon = Math::getEpsilon<float>();

            out = aiMatrix4x4();

            bool is_id[3] = { true, true, true };

            aiMatrix4x4 temp[3];
            if (std::fabs(rotation.z) > angle_epsilon) {
                aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(rotation.z), temp[2]);
                is_id[2] = false;
            }
            if (std::fabs(rotation.y) > angle_epsilon) {
                aiMatrix4x4::RotationY(AI_DEG_TO_RAD(rotation.y), temp[1]);
                is_id[1] = false;
            }
            if (std::fabs(rotation.x) > angle_epsilon) {
                aiMatrix4x4::RotationX(AI_DEG_TO_RAD(rotation.x), temp[0]);
                is_id[0] = false;
            }

            int order[3] = { -1, -1, -1 };

            // note: rotation order is inverted since we're left multiplying as is usual in assimp
            switch (mode)
            {
            case Model::RotOrder_EulerXYZ:
                order[0] = 2;
                order[1] = 1;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerXZY:
                order[0] = 1;
                order[1] = 2;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerYZX:
                order[0] = 0;
                order[1] = 2;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerYXZ:
                order[0] = 2;
                order[1] = 0;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerZXY:
                order[0] = 1;
                order[1] = 0;
                order[2] = 2;
                break;

            case Model::RotOrder_EulerZYX:
                order[0] = 0;
                order[1] = 1;
                order[2] = 2;
                break;

            default:
                ai_assert(false);
                break;
            }

            ai_assert(order[0] >= 0);
            ai_assert(order[0] <= 2);
            ai_assert(order[1] >= 0);
            ai_assert(order[1] <= 2);
            ai_assert(order[2] >= 0);
            ai_assert(order[2] <= 2);

            if (!is_id[order[0]]) {
                out = temp[order[0]];
            }

            if (!is_id[order[1]]) {
                out = out * temp[order[1]];
            }

            if (!is_id[order[2]]) {
                out = out * temp[order[2]];
            }
        }